

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::Tokenizer::NextWithComments
          (Tokenizer *this,string *prev_trailing_comments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments,string *next_leading_comments)

{
  undefined1 uVar1;
  NextCommentStatus NVar2;
  CommentCollector collector;
  
  if (prev_trailing_comments != (string *)0x0) {
    prev_trailing_comments->_M_string_length = 0;
    *(prev_trailing_comments->_M_dataplus)._M_p = '\0';
  }
  if (detached_comments !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(detached_comments,
                      (detached_comments->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
  }
  if (next_leading_comments != (string *)0x0) {
    next_leading_comments->_M_string_length = 0;
    *(next_leading_comments->_M_dataplus)._M_p = '\0';
  }
  if ((this->current_).type == TYPE_START) {
    while (((ulong)(byte)this->current_char_ < 0x21 &&
           ((0x100003a00U >> ((ulong)(byte)this->current_char_ & 0x3f) & 1) != 0))) {
      NextChar(this);
    }
    NVar2 = TryConsumeCommentStart(this);
    uVar1 = (*(code *)(&DAT_001d2670 + *(int *)(&DAT_001d2670 + (ulong)NVar2 * 4)))();
    return (bool)uVar1;
  }
  while (((ulong)(byte)this->current_char_ < 0x21 &&
         ((0x100003a00U >> ((ulong)(byte)this->current_char_ & 0x3f) & 1) != 0))) {
    NextChar(this);
  }
  NVar2 = TryConsumeCommentStart(this);
  uVar1 = (*(code *)(&DAT_001d2660 + *(int *)(&DAT_001d2660 + (ulong)NVar2 * 4)))();
  return (bool)uVar1;
}

Assistant:

bool Tokenizer::NextWithComments(string* prev_trailing_comments,
                                 vector<string>* detached_comments,
                                 string* next_leading_comments) {
  CommentCollector collector(prev_trailing_comments, detached_comments,
                             next_leading_comments);

  if (current_.type == TYPE_START) {
    collector.DetachFromPrev();
  } else {
    // A comment appearing on the same line must be attached to the previous
    // declaration.
    ConsumeZeroOrMore<WhitespaceNoNewline>();
    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        ConsumeZeroOrMore<WhitespaceNoNewline>();
        if (!TryConsume('\n')) {
          // Oops, the next token is on the same line.  If we recorded a comment
          // we really have no idea which token it should be attached to.
          collector.ClearBuffer();
          return Next();
        }

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (!TryConsume('\n')) {
          // The next token is on the same line.  There are no comments.
          return Next();
        }
        break;
    }
  }

  // OK, we are now on the line *after* the previous token.
  while (true) {
    ConsumeZeroOrMore<WhitespaceNoNewline>();

    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        // Consume the rest of the line so that we don't interpret it as a
        // blank line the next time around the loop.
        ConsumeZeroOrMore<WhitespaceNoNewline>();
        TryConsume('\n');
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (TryConsume('\n')) {
          // Completely blank line.
          collector.Flush();
          collector.DetachFromPrev();
        } else {
          bool result = Next();
          if (!result ||
              current_.text == "}" ||
              current_.text == "]" ||
              current_.text == ")") {
            // It looks like we're at the end of a scope.  In this case it
            // makes no sense to attach a comment to the following token.
            collector.Flush();
          }
          return result;
        }
        break;
    }
  }
}